

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

uint16_t get_attr_pos(lyd_attr *attr,lyd_node *parent)

{
  bool bVar1;
  uint16_t uVar2;
  lyd_attr *plVar3;
  
  plVar3 = parent->attr;
  bVar1 = plVar3 != (lyd_attr *)0x0;
  if (plVar3 == attr || plVar3 == (lyd_attr *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      uVar2 = uVar2 + 1;
      plVar3 = plVar3->next;
      bVar1 = plVar3 != (lyd_attr *)0x0;
      if (plVar3 == (lyd_attr *)0x0) break;
    } while (plVar3 != attr);
  }
  if (!bVar1) {
    __assert_fail("attr2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x48b,"uint16_t get_attr_pos(struct lyd_attr *, const struct lyd_node *)");
  }
  return uVar2;
}

Assistant:

static uint16_t
get_attr_pos(struct lyd_attr *attr, const struct lyd_node *parent)
{
    uint16_t pos = 0;
    struct lyd_attr *attr2;

    for (attr2 = parent->attr; attr2 && (attr2 != attr); attr2 = attr2->next) {
        ++pos;
    }

    assert(attr2);
    return pos;
}